

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  int iVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  example *peVar4;
  action_score *paVar5;
  int *piVar6;
  wclass *pwVar7;
  wclass *pwVar8;
  _func_void_int_string_v_array<char> *p_Var9;
  v_array<char> vVar10;
  ostream *poVar11;
  size_t num_features;
  long lVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  bool test_example;
  iterator __end1;
  iterator __begin1;
  pointer ppeVar17;
  float *pfVar18;
  multi_ex *__range1;
  float loss;
  float fVar19;
  example *ec;
  undefined4 in_stack_fffffffffffffdf0;
  float fVar20;
  vw *pvVar21;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar12 = (long)ppeVar3 - (long)ppeVar2;
  if (lVar12 != 0) {
    peVar4 = *ppeVar2;
    paVar5 = (peVar4->pred).a_s._begin;
    num_features = 0;
    for (ppeVar17 = ppeVar2; ppeVar17 != ppeVar3; ppeVar17 = ppeVar17 + 1) {
      num_features = num_features + (*ppeVar17)->num_features;
    }
    fVar20 = (c->gen_cs).known_cost.probability;
    loss = 0.0;
    test_example = 0.0 < fVar20;
    if (0.0 < fVar20) {
      for (uVar14 = 0; uVar15 = (ulong)uVar14,
          uVar15 < (ulong)((long)(peVar4->pred).scalars._end - (long)paVar5 >> 3);
          uVar14 = uVar14 + 1) {
        fVar19 = (c->gen_cs).known_cost.cost / fVar20;
        if ((c->gen_cs).known_cost.action != paVar5[uVar15].action) {
          fVar19 = 0.0;
        }
        loss = loss + fVar19 * paVar5[uVar15].score;
      }
    }
    for (lVar16 = 0; lVar12 >> 3 != lVar16; lVar16 = lVar16 + 1) {
      test_example = (bool)(test_example & ppeVar2[lVar16]->test_only);
    }
    ec = peVar4;
    shared_data::update(all->sd,test_example,0.0 < fVar20,loss,peVar4->weight,num_features);
    piVar6 = (all->final_prediction_sink)._end;
    for (piVar13 = (all->final_prediction_sink)._begin; piVar13 != piVar6; piVar13 = piVar13 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar13,(v_array<ACTION_SCORE::action_score> *)&(peVar4->pred).scalars,
                 &peVar4->tag);
    }
    if (0 < all->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pwVar7 = (ec->l).cs.costs._begin;
      pwVar8 = (ec->l).cs.costs._end;
      pfVar18 = &pwVar7->wap_value;
      for (lVar12 = 0; (long)pwVar8 - (long)pwVar7 >> 4 != lVar12; lVar12 = lVar12 + 1) {
        if (lVar12 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar11 = std::operator<<(poVar11,':');
        std::ostream::operator<<(poVar11,*pfVar18);
        pfVar18 = pfVar18 + 4;
      }
      p_Var9 = all->print_text;
      iVar1 = all->raw_prediction;
      pvVar21 = all;
      std::__cxx11::stringbuf::str();
      vVar10._end._0_4_ = in_stack_fffffffffffffdf0;
      vVar10._begin = (char *)ec;
      vVar10._end._4_4_ = fVar20;
      vVar10.end_array = (char *)ec_seq;
      vVar10.erase_count = (size_t)pvVar21;
      (*p_Var9)(iVar1,(string)peVar4->tag,vVar10);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    CB::print_update(all,fVar20 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (const auto& example : ec_seq)
  {
    num_features += example->num_features;
  }

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}